

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O0

void __thiscall QPDF::flattenPagesTree(QPDF *this)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  pointer pMVar4;
  reference pvVar5;
  unsigned_long_long uVar6;
  runtime_error *this_00;
  QPDFObjectHandle local_180;
  allocator<char> local_169;
  string local_168;
  byte local_144;
  byte local_143;
  byte local_142;
  allocator<char> local_141;
  string local_140 [32];
  QPDFObjectHandle local_120;
  allocator<char> local_109;
  string local_108 [32];
  QPDFObjectHandle local_e8;
  QPDFObjectHandle local_d8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  unsigned_long local_78;
  size_t pos;
  size_t len;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [24];
  QPDFObjectHandle pages;
  QPDF *this_local;
  
  pages.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  bVar2 = std::
          map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
          ::empty(&pMVar4->pageobj_to_pages_pos);
  if (bVar2) {
    pushInheritedAttributesToPage(this,true,true);
    getRoot((QPDF *)local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"/Pages",&local_51);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_30 + 0x10),(string *)local_30);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pos = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(&pMVar4->all_pages)
    ;
    for (local_78 = 0; local_78 < pos; local_78 = local_78 + 1) {
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      pvVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                         (&pMVar4->all_pages,local_78);
      iVar3 = toI<unsigned_long>(&local_78);
      insertPageobjToPage(this,pvVar5,iVar3,true);
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      pvVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                         (&pMVar4->all_pages,local_78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"/Parent",&local_99);
      QPDFObjectHandle::replaceKey(pvVar5,&local_98,(QPDFObjectHandle *)(local_30 + 0x10));
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"/Kids",&local_c1);
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    QPDFObjectHandle::newArray(&local_d8,&pMVar4->all_pages);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)(local_30 + 0x10),&local_c0,&local_d8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_108,"/Count",&local_109);
    QPDFObjectHandle::getKey(&local_e8,(string *)(local_30 + 0x10));
    uVar6 = QPDFObjectHandle::getUIntValue(&local_e8);
    sVar1 = pos;
    QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
    if (uVar6 != sVar1) {
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      local_142 = 0;
      local_143 = 0;
      local_144 = 0;
      bVar2 = false;
      if ((pMVar4->invalid_page_found & 1U) != 0) {
        std::allocator<char>::allocator();
        local_142 = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_140,"/Count",&local_141);
        local_143 = 1;
        QPDFObjectHandle::getKey(&local_120,(string *)(local_30 + 0x10));
        local_144 = 1;
        uVar6 = QPDFObjectHandle::getUIntValue(&local_120);
        bVar2 = pos < uVar6;
      }
      if ((local_144 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_120);
      }
      if ((local_143 & 1) != 0) {
        std::__cxx11::string::~string(local_140);
      }
      if ((local_142 & 1) != 0) {
        std::allocator<char>::~allocator(&local_141);
      }
      if (!bVar2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"/Count is wrong after flattening pages tree");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"/Count",&local_169);
      iVar3 = toI<unsigned_long>(&pos);
      QPDFObjectHandle::newInteger(&local_180,(long)iVar3);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)(local_30 + 0x10),&local_168,&local_180);
      QPDFObjectHandle::~QPDFObjectHandle(&local_180);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_30 + 0x10));
  }
  return;
}

Assistant:

void
QPDF::flattenPagesTree()
{
    // If not already done, flatten the /Pages structure and initialize pageobj_to_pages_pos.

    if (!m->pageobj_to_pages_pos.empty()) {
        return;
    }

    // Push inherited objects down to the /Page level.  As a side effect m->all_pages will also be
    // generated.
    pushInheritedAttributesToPage(true, true);

    QPDFObjectHandle pages = getRoot().getKey("/Pages");

    size_t const len = m->all_pages.size();
    for (size_t pos = 0; pos < len; ++pos) {
        // Populate pageobj_to_pages_pos and fix parent pointer. There should be no duplicates at
        // this point because pushInheritedAttributesToPage calls getAllPages which resolves
        // duplicates.
        insertPageobjToPage(m->all_pages.at(pos), toI(pos), true);
        m->all_pages.at(pos).replaceKey("/Parent", pages);
    }

    pages.replaceKey("/Kids", QPDFObjectHandle::newArray(m->all_pages));
    // /Count has not changed
    if (pages.getKey("/Count").getUIntValue() != len) {
        if (m->invalid_page_found && pages.getKey("/Count").getUIntValue() > len) {
            pages.replaceKey("/Count", QPDFObjectHandle::newInteger(toI(len)));
        } else {
            throw std::runtime_error("/Count is wrong after flattening pages tree");
        }
    }
}